

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

ostream * util::math::internal_vector::operator<<(ostream *out,D *v)

{
  D *out_00;
  ostream *poVar1;
  double local_30;
  int local_24;
  char *pcStack_20;
  int i;
  char *sep;
  D *v_local;
  ostream *out_local;
  
  sep = (char *)v;
  v_local = (D *)out;
  std::operator<<(out,"[");
  pcStack_20 = "";
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    std::operator<<((ostream *)v_local,pcStack_20);
    out_00 = v_local;
    local_30 = BasicVector<Vector2,_double,_2UL>::operator[]
                         ((BasicVector<Vector2,_double,_2UL> *)sep,local_24);
    BasicVector<Vector2,_double,_2UL>::Print<double>((ostream *)out_00,&local_30);
    pcStack_20 = ", ";
  }
  poVar1 = std::operator<<((ostream *)v_local,"]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const D& v) {
    out << "[";
    const char *sep = "";
    for (int i = 0; i < SIZE; ++i) {
      out << sep;
      Print(out, v[i]);
      sep = ", ";
    }
    return out << "]";
  }